

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

Vec_Int_t * Abc_NtkCollectCoSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *vArr;
  Vec_Int_t *pVVar4;
  int *piVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  timespec ts;
  timespec local_78;
  Abc_Ntk_t *local_60;
  int local_54;
  long local_50;
  Vec_Int_t *local_48;
  Vec_Ptr_t *local_40;
  long local_38;
  
  local_54 = fVerbose;
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    local_50 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_50 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  piVar5 = (int *)0x0;
  __ptr = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)malloc(0x10);
  vArr->nCap = 0;
  vArr->nSize = 0;
  vArr->pArray = (int *)0x0;
  iVar3 = pNtk->vCos->nSize;
  local_60 = pNtk;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar8 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar8;
  if (iVar8 != 0) {
    piVar5 = (int *)malloc((long)iVar8 << 2);
  }
  pAVar2 = local_60;
  pVVar4->pArray = piVar5;
  iVar3 = local_60->vObjs->nSize;
  piVar5 = (int *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar3 - 1U) {
    iVar8 = iVar3;
  }
  piVar5[1] = 0;
  *piVar5 = iVar8;
  if (iVar8 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)iVar8,0x10);
  }
  *(void **)(piVar5 + 2) = pvVar6;
  piVar5[1] = iVar3;
  pVVar7 = pAVar2->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      iVar8 = *(int *)((long)pVVar7->pArray[lVar9] + 0x10);
      if (((long)iVar8 < 0) || (iVar3 <= iVar8)) goto LAB_002eea27;
      Vec_IntPush((Vec_Int_t *)((long)iVar8 * 0x10 + (long)pvVar6),(int)lVar9);
      lVar9 = lVar9 + 1;
      pVVar7 = local_60->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  local_48 = pVVar4;
  if (0 < __ptr->nSize) {
    lVar9 = 0;
    local_40 = __ptr;
    do {
      pvVar6 = local_40->pArray[lVar9];
      iVar3 = *(int *)((long)pvVar6 + 0x10);
      local_38 = lVar9;
      if (((long)iVar3 < 0) || (iVar8 = piVar5[1], iVar8 <= iVar3)) goto LAB_002eea27;
      if (0 < *(int *)((long)pvVar6 + 0x1c)) {
        lVar9 = *(long *)(piVar5 + 2);
        pVVar4 = (Vec_Int_t *)((long)iVar3 * 0x10 + lVar9);
        lVar10 = 0;
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar10 * 4);
          if (((long)iVar3 < 0) || (iVar8 <= iVar3)) goto LAB_002eea27;
          Vec_IntTwoMerge2(pVVar4,(Vec_Int_t *)((long)iVar3 * 0x10 + lVar9),vArr);
          local_78.tv_sec._0_4_ = pVVar4->nCap;
          local_78.tv_sec._4_4_ = pVVar4->nSize;
          local_78.tv_nsec = (long)pVVar4->pArray;
          iVar3 = vArr->nSize;
          piVar1 = vArr->pArray;
          pVVar4->nCap = vArr->nCap;
          pVVar4->nSize = iVar3;
          pVVar4->pArray = piVar1;
          vArr->nCap = (undefined4)local_78.tv_sec;
          vArr->nSize = local_78.tv_sec._4_4_;
          vArr->pArray = (int *)local_78.tv_nsec;
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar6 + 0x1c));
      }
      lVar9 = local_38 + 1;
      __ptr = local_40;
    } while (lVar9 < local_40->nSize);
  }
  pVVar4 = local_48;
  pAVar2 = local_60;
  pVVar7 = local_60->vCos;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      iVar3 = **(int **)((long)pVVar7->pArray[lVar9] + 0x20);
      if (((long)iVar3 < 0) || (piVar5[1] <= iVar3)) {
LAB_002eea27:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar4,*(int *)(*(long *)(piVar5 + 2) + 4 + (long)iVar3 * 0x10));
      lVar9 = lVar9 + 1;
      pVVar7 = pAVar2->vCos;
    } while (lVar9 < pVVar7->nSize);
  }
  iVar3 = *piVar5;
  if (0 < (long)iVar3) {
    lVar9 = *(long *)(piVar5 + 2);
    lVar10 = 0;
    do {
      pvVar6 = *(void **)(lVar9 + 8 + lVar10);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)(lVar9 + 8 + lVar10) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar10);
  }
  if (*(void **)(piVar5 + 2) != (void *)0x0) {
    free(*(void **)(piVar5 + 2));
    piVar5[2] = 0;
    piVar5[3] = 0;
  }
  piVar5[0] = 0;
  piVar5[1] = 0;
  free(piVar5);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
    vArr->pArray = (int *)0x0;
  }
  free(vArr);
  if (local_54 != 0) {
    iVar8 = 3;
    iVar3 = clock_gettime(3,&local_78);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar9 = lVar9 + local_50;
    Abc_Print(iVar8,"%s =","Input  support computation");
    Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)lVar9 / 1000000.0,0));
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCoSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCo = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Abc_ObjId(pNode)), i );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanout, vFanin, vTemp ); 
            ABC_SWAP( Vec_Int_t, *vFanout, *vTemp );
        }
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
        Vec_IntPush( vSuppsCo, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Input  support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCo );
    return vSuppsCo;
}